

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCDictSize_advanced
                 (size_t dictSize,ZSTD_compressionParameters cParams,
                 ZSTD_dictLoadMethod_e dictLoadMethod)

{
  size_t sVar1;
  size_t local_28;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  
  sVar1 = ZSTD_sizeof_matchState(&cParams,0);
  local_28 = dictSize;
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    local_28 = 0;
  }
  return sVar1 + 0x2b08 + local_28;
}

Assistant:

size_t ZSTD_estimateCDictSize_advanced(
        size_t dictSize, ZSTD_compressionParameters cParams,
        ZSTD_dictLoadMethod_e dictLoadMethod)
{
    DEBUGLOG(5, "sizeof(ZSTD_CDict) : %u", (unsigned)sizeof(ZSTD_CDict));
    return sizeof(ZSTD_CDict) + HUF_WORKSPACE_SIZE + ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0)
           + (dictLoadMethod == ZSTD_dlm_byRef ? 0 : dictSize);
}